

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
BasicResult<Catch::clara::detail::ParseResultType>
          (BasicResult<Catch::clara::detail::ParseState> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *other)

{
  Type TVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *other_local;
  BasicResult<Catch::clara::detail::ParseState> *this_local;
  
  TVar1 = detail::BasicResult<Catch::clara::detail::ParseResultType>::type(other);
  ResultValueBase<Catch::clara::detail::ParseState>::ResultValueBase
            (&this->super_ResultValueBase<Catch::clara::detail::ParseState>,TVar1);
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_0029bfd0;
  detail::BasicResult<Catch::clara::detail::ParseResultType>::errorMessage_abi_cxx11_
            (&this->m_errorMessage,other);
  TVar1 = type(this);
  if (TVar1 != Ok) {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                ,0x232b,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }